

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

void EXPLORE_EVAL::output_example(vw *all,explore_eval *c,example *ec,multi_ex *ec_seq)

{
  undefined4 uVar1;
  value_type peVar2;
  code *pcVar3;
  bool bVar4;
  _Ios_Openmode _Var5;
  reference ppeVar6;
  size_type sVar7;
  ulong uVar8;
  size_t sVar9;
  action_score *paVar10;
  int **ppiVar11;
  cb_class *pcVar12;
  ostream *poVar13;
  vector<example_*,_std::allocator<example_*>_> *in_RCX;
  long in_RDX;
  cb_class *in_RSI;
  undefined8 *in_RDI;
  float fVar14;
  size_t i_3;
  v_array<CB::cb_class> costs;
  stringstream outputStringStream;
  string outputString;
  int sink;
  int *__end1;
  int *__begin1;
  v_array<int> *__range1;
  size_t i_2;
  bool holdout_example;
  float l;
  uint32_t i_1;
  bool labeled_example;
  size_t i;
  action_scores preds;
  float loss;
  size_t num_features;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  example *in_stack_fffffffffffffcc8;
  string local_290 [32];
  ulong local_270;
  v_array<CB::cb_class> local_268;
  stringstream local_238 [16];
  ostream local_228;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  v_array<ACTION_SCORE::action_score> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff1f;
  vw *in_stack_ffffffffffffff20;
  string local_b0 [36];
  int local_8c;
  int *local_88;
  int *local_80;
  v_array<int> *local_78;
  ulong local_70;
  bool local_65;
  float local_64;
  uint local_60;
  byte local_59;
  ulong local_58;
  v_array<ACTION_SCORE::action_score> local_50;
  float local_2c;
  size_t local_28;
  vector<example_*,_std::allocator<example_*>_> *local_20;
  long local_18;
  cb_class *local_10;
  undefined8 *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar4 = CB_ALGS::example_is_newline_not_header
                    ((example *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  if (!bVar4) {
    local_28 = 0;
    local_2c = 0.0;
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,0);
    peVar2 = *ppeVar6;
    local_50._begin = (action_score *)(peVar2->pred).scalars._begin;
    local_50._end = (action_score *)(peVar2->pred).scalars._end;
    local_50.end_array = (action_score *)(peVar2->pred).scalars.end_array;
    local_50.erase_count = (peVar2->pred).scalars.erase_count;
    for (local_58 = 0; uVar8 = local_58,
        sVar7 = std::vector<example_*,_std::allocator<example_*>_>::size(local_20), uVar8 < sVar7;
        local_58 = local_58 + 1) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_58);
      bVar4 = CB::ec_is_example_header(in_stack_fffffffffffffcc8);
      if (!bVar4) {
        ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_58);
        local_28 = (*ppeVar6)->num_features + local_28;
      }
    }
    local_59 = 1;
    if (local_10->probability <= 0.0) {
      local_59 = 0;
    }
    else {
      for (local_60 = 0; uVar8 = (ulong)local_60,
          sVar9 = v_array<ACTION_SCORE::action_score>::size(&local_50), pcVar12 = local_10,
          uVar8 < sVar9; local_60 = local_60 + 1) {
        paVar10 = v_array<ACTION_SCORE::action_score>::operator[](&local_50,(ulong)local_60);
        fVar14 = CB_ALGS::get_unbiased_cost(pcVar12,paVar10->action,0.0);
        local_64 = fVar14;
        paVar10 = v_array<ACTION_SCORE::action_score>::operator[](&local_50,(ulong)local_60);
        local_2c = fVar14 * paVar10->score + local_2c;
      }
    }
    local_65 = (bool)(local_59 & 1);
    for (local_70 = 0; uVar8 = local_70,
        sVar7 = std::vector<example_*,_std::allocator<example_*>_>::size(local_20), uVar8 < sVar7;
        local_70 = local_70 + 1) {
      ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](local_20,local_70);
      local_65 = (local_65 & 1U & (*ppeVar6)->test_only & 1U) != 0;
    }
    shared_data::update((shared_data *)*local_8,(bool)(local_65 & 1),(bool)(local_59 & 1),local_2c,
                        *(float *)(local_18 + 0x6870),local_28);
    local_78 = (v_array<int> *)(local_8 + 0x6a2);
    ppiVar11 = v_array<int>::begin(local_78);
    local_80 = *ppiVar11;
    ppiVar11 = v_array<int>::end(local_78);
    local_88 = *ppiVar11;
    for (; local_80 != local_88; local_80 = local_80 + 1) {
      local_8c = *local_80;
      ACTION_SCORE::print_action_score
                (in_stack_ffffffffffffff14,in_stack_ffffffffffffff08,
                 (v_array<char> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
    }
    if (0 < *(int *)(local_8 + 0x6a6)) {
      std::__cxx11::string::string(local_b0);
      _Var5 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_238,local_b0,_Var5);
      local_268._begin = *(cb_class **)(local_18 + 0x6828);
      local_268._end = *(cb_class **)(local_18 + 0x6830);
      local_268.end_array = *(cb_class **)(local_18 + 0x6838);
      local_268.erase_count = *(size_t *)(local_18 + 0x6840);
      for (local_270 = 0; uVar8 = local_270, sVar9 = v_array<CB::cb_class>::size(&local_268),
          uVar8 < sVar9; local_270 = local_270 + 1) {
        if (local_270 != 0) {
          std::operator<<(&local_228,' ');
        }
        pcVar12 = v_array<CB::cb_class>::operator[](&local_268,local_270);
        poVar13 = (ostream *)std::ostream::operator<<(&local_228,pcVar12->action);
        poVar13 = std::operator<<(poVar13,':');
        pcVar12 = v_array<CB::cb_class>::operator[](&local_268,local_270);
        std::ostream::operator<<(poVar13,pcVar12->partial_prediction);
      }
      pcVar3 = (code *)local_8[0x6a8];
      uVar1 = *(undefined4 *)(local_8 + 0x6a6);
      std::__cxx11::stringstream::str();
      (*pcVar3)(uVar1,local_290);
      std::__cxx11::string::~string(local_290);
      std::__cxx11::stringstream::~stringstream(local_238);
      std::__cxx11::string::~string(local_b0);
    }
    CB::print_update(in_stack_ffffffffffffff20,(bool)in_stack_ffffffffffffff1f,
                     (example *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (multi_ex *)in_stack_ffffffffffffff08,(bool)in_stack_ffffffffffffff07);
  }
  return;
}

Assistant:

void output_example(vw& all, explore_eval& c, example& ec, multi_ex* ec_seq)
{
  if (example_is_newline_not_header(ec))
    return;

  size_t num_features = 0;

  float loss = 0.;
  ACTION_SCORE::action_scores preds = (*ec_seq)[0]->pred.a_s;

  for (size_t i = 0; i < (*ec_seq).size(); i++)
    if (!CB::ec_is_example_header(*(*ec_seq)[i]))
      num_features += (*ec_seq)[i]->num_features;

  bool labeled_example = true;
  if (c.known_cost.probability > 0)
  {
    for (uint32_t i = 0; i < preds.size(); i++)
    {
      float l = get_unbiased_cost(&c.known_cost, preds[i].action);
      loss += l * preds[i].score;
    }
  }
  else
    labeled_example = false;

  bool holdout_example = labeled_example;
  for (size_t i = 0; i < ec_seq->size(); i++) holdout_example &= (*ec_seq)[i]->test_only;

  all.sd->update(holdout_example, labeled_example, loss, ec.weight, num_features);

  for (int sink : all.final_prediction_sink) print_action_score(sink, ec.pred.a_s, ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    v_array<CB::cb_class> costs = ec.l.cb.costs;

    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].action << ':' << costs[i].partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  CB::print_update(all, !labeled_example, ec, ec_seq, true);
}